

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

void __thiscall PointBlock<3U>::generate_points(PointBlock<3U> *this,Bounds *domain,size_t n)

{
  float fVar1;
  int iVar2;
  const_reference pfVar3;
  reference pvVar4;
  ulong in_RDX;
  long in_RDI;
  float fVar5;
  uint j;
  size_t i;
  Bounds<float> *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar6;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *in_stack_ffffffffffffffe0;
  ulong __n;
  
  diy::Bounds<float>::operator=
            ((Bounds<float> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::resize
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
            );
  for (__n = 0; __n < in_RDX; __n = __n + 1) {
    for (uVar6 = 0; uVar6 < 3; uVar6 = uVar6 + 1) {
      pfVar3 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (size_type)in_stack_ffffffffffffffb8);
      fVar1 = *pfVar3;
      iVar2 = rand();
      in_stack_ffffffffffffffc4 = (float)(iVar2 % 0x400) / 1024.0;
      pfVar3 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (size_type)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 = *pfVar3;
      pfVar3 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (size_type)in_stack_ffffffffffffffb8);
      fVar5 = in_stack_ffffffffffffffc4 * (in_stack_ffffffffffffffc0 - *pfVar3);
      std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::operator[]
                ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 (in_RDI + 0x100),__n);
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (size_type)in_stack_ffffffffffffffb8);
      *pvVar4 = fVar5 + fVar1;
    }
  }
  return;
}

Assistant:

void            generate_points(const Bounds& domain, // overall data bounds
                                    size_t n)             // number of points
    {
        box = domain;
        points.resize(n);
        for (size_t i = 0; i < n; ++i)
            for (unsigned j = 0; j < DIM; ++j)
                points[i][j] = domain.min[j] + float(rand() % 1024)/1024 *
                    (domain.max[j] - domain.min[j]);
    }